

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.cc
# Opt level: O1

void brotli::StoreDataWithHuffmanCodes
               (uint8_t *input,size_t start_pos,size_t mask,Command *commands,size_t n_commands,
               uint8_t *lit_depth,uint16_t *lit_bits,uint8_t *cmd_depth,uint16_t *cmd_bits,
               uint8_t *dist_depth,uint16_t *dist_bits,size_t *storage_ix,uint8_t *storage)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  
  if (n_commands != 0) {
    sVar7 = 0;
    do {
      uVar2 = commands[sVar7].cmd_prefix_;
      bVar1 = cmd_depth[uVar2];
      if (cmd_bits[uVar2] >> (bVar1 & 0x3f) != 0) {
LAB_0017b365:
        __assert_fail("(bits >> n_bits) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/deps/brotli/enc/././write_bits.h"
                      ,0x2c,
                      "void brotli::WriteBits(size_t, uint64_t, size_t *__restrict, uint8_t *__restrict)"
                     );
      }
      if (0x38 < bVar1) {
LAB_0017b346:
        __assert_fail("n_bits <= 56",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/deps/brotli/enc/././write_bits.h"
                      ,0x2d,
                      "void brotli::WriteBits(size_t, uint64_t, size_t *__restrict, uint8_t *__restrict)"
                     );
      }
      uVar8 = (ulong)commands[sVar7].insert_len_;
      uVar4 = commands[sVar7].copy_len_;
      uVar6 = commands[sVar7].cmd_extra_;
      uVar10 = *storage_ix;
      uVar9 = bVar1 + uVar10;
      uVar5 = commands[sVar7].dist_extra_;
      uVar3 = commands[sVar7].dist_prefix_;
      *(ulong *)(storage + (uVar10 >> 3)) =
           (ulong)cmd_bits[uVar2] << ((byte)uVar10 & 7) | (ulong)storage[uVar10 >> 3];
      *storage_ix = uVar9;
      if ((uVar6 & 0xffffffffffff) >> ((byte)(uVar6 >> 0x30) & 0x3f) != 0) goto LAB_0017b365;
      if (0x38 < (ushort)(uVar6 >> 0x30)) goto LAB_0017b346;
      *(ulong *)(storage + (uVar9 >> 3)) =
           (uVar6 & 0xffffffffffff) << ((byte)uVar9 & 7) | (ulong)storage[uVar9 >> 3];
      *storage_ix = (uVar6 >> 0x30) + uVar9;
      for (; uVar8 != 0; uVar8 = uVar8 - 1) {
        bVar1 = lit_depth[input[start_pos & mask]];
        if (lit_bits[input[start_pos & mask]] >> (bVar1 & 0x3f) != 0) goto LAB_0017b365;
        if (0x38 < bVar1) goto LAB_0017b346;
        uVar6 = *storage_ix;
        *(ulong *)(storage + (uVar6 >> 3)) =
             (ulong)lit_bits[input[start_pos & mask]] << ((byte)uVar6 & 7) |
             (ulong)storage[uVar6 >> 3];
        *storage_ix = bVar1 + uVar6;
        start_pos = start_pos + 1;
      }
      if ((ulong)uVar4 != 0 && 0x7f < uVar2) {
        bVar1 = dist_depth[uVar3];
        if (dist_bits[uVar3] >> (bVar1 & 0x3f) != 0) goto LAB_0017b365;
        if (0x38 < bVar1) goto LAB_0017b346;
        uVar6 = *storage_ix;
        uVar10 = bVar1 + uVar6;
        *(ulong *)(storage + (uVar6 >> 3)) =
             (ulong)dist_bits[uVar3] << ((byte)uVar6 & 7) | (ulong)storage[uVar6 >> 3];
        *storage_ix = uVar10;
        if ((uVar5 & 0xffffff) >> ((byte)(uVar5 >> 0x18) & 0x3f) != 0) goto LAB_0017b365;
        if (0x38ffffff < uVar5) goto LAB_0017b346;
        *(ulong *)(storage + (uVar10 >> 3)) =
             (ulong)(uVar5 & 0xffffff) << ((byte)uVar10 & 7) | (ulong)storage[uVar10 >> 3];
        *storage_ix = (uVar5 >> 0x18) + uVar10;
      }
      start_pos = start_pos + uVar4;
      sVar7 = sVar7 + 1;
    } while (sVar7 != n_commands);
  }
  return;
}

Assistant:

void StoreDataWithHuffmanCodes(const uint8_t* input,
                               size_t start_pos,
                               size_t mask,
                               const brotli::Command *commands,
                               size_t n_commands,
                               const uint8_t* lit_depth,
                               const uint16_t* lit_bits,
                               const uint8_t* cmd_depth,
                               const uint16_t* cmd_bits,
                               const uint8_t* dist_depth,
                               const uint16_t* dist_bits,
                               size_t* storage_ix,
                               uint8_t* storage) {
  size_t pos = start_pos;
  for (size_t i = 0; i < n_commands; ++i) {
    const Command cmd = commands[i];
    const size_t cmd_code = cmd.cmd_prefix_;
    const uint32_t lennumextra = static_cast<uint32_t>(cmd.cmd_extra_ >> 48);
    const uint64_t lenextra = cmd.cmd_extra_ & 0xffffffffffffUL;
    WriteBits(cmd_depth[cmd_code], cmd_bits[cmd_code], storage_ix, storage);
    WriteBits(lennumextra, lenextra, storage_ix, storage);
    for (size_t j = cmd.insert_len_; j != 0; --j) {
      const uint8_t literal = input[pos & mask];
      WriteBits(lit_depth[literal], lit_bits[literal], storage_ix, storage);
      ++pos;
    }
    pos += cmd.copy_len_;
    if (cmd.copy_len_ > 0 && cmd.cmd_prefix_ >= 128) {
      const size_t dist_code = cmd.dist_prefix_;
      const uint32_t distnumextra = cmd.dist_extra_ >> 24;
      const uint32_t distextra = cmd.dist_extra_ & 0xffffff;
      WriteBits(dist_depth[dist_code], dist_bits[dist_code],
                storage_ix, storage);
      WriteBits(distnumextra, distextra, storage_ix, storage);
    }
  }
}